

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_replace(REF_CAVITY ref_cavity)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  REF_GEOM ref_geom_00;
  uint uVar2;
  int local_18c;
  REF_INT local_188;
  REF_INT local_184;
  int local_180;
  REF_INT local_17c;
  REF_INT local_178;
  int local_174;
  int local_170;
  int local_16c;
  REF_INT local_168;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_LIST pRStack_d8;
  REF_STATUS ref_private_macro_code_rss;
  REF_LIST ref_list;
  REF_DBL volume;
  int local_c0;
  REF_INT item;
  REF_INT i;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT seg;
  REF_INT face;
  REF_INT node;
  REF_INT nodes [27];
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_CAVITY ref_cavity_local;
  
  pRVar1 = ref_cavity->ref_grid;
  ref_node_00 = pRVar1->node;
  ref_geom_00 = pRVar1->geom;
  if ((ref_cavity->debug == 0) ||
     (ref_cavity_local._4_4_ = ref_cavity_tec(ref_cavity,"ref_cavity_replace.tec"),
     ref_cavity_local._4_4_ == 0)) {
    if ((ulong)ref_cavity->state == 1) {
      ref_cavity_local._4_4_ = ref_cavity_verify_face_manifold(ref_cavity);
      if (ref_cavity_local._4_4_ == 0) {
        ref_cavity_local._4_4_ = ref_cavity_verify_seg_manifold(ref_cavity);
        if (ref_cavity_local._4_4_ == 0) {
          if ((ulong)ref_cavity->state == 1) {
            if ((((ref_cavity->nseg == 0) && (ref_cavity->nface == 0)) &&
                (ref_cavity->tri_list->n == 0)) && (ref_cavity->tet_list->n == 0)) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x28e,"ref_cavity_replace","attempt noop");
              ref_cavity_local._4_4_ = 1;
            }
            else {
              seg = ref_cavity->node;
              stack0xffffffffffffffc8 = ref_cavity->ref_grid->cell[8];
              for (cell = 0; cell < ref_cavity->maxface; cell = cell + 1) {
                if (((-1 < cell) && (cell < ref_cavity->maxface)) &&
                   (ref_cavity->f2n[cell * 3] != -1)) {
                  face = ref_cavity->f2n[cell * 3];
                  node = ref_cavity->f2n[cell * 3 + 1];
                  nodes[0] = ref_cavity->f2n[cell * 3 + 2];
                  nodes[1] = seg;
                  if (((seg != ref_cavity->f2n[cell * 3]) && (seg != ref_cavity->f2n[cell * 3 + 1]))
                     && (seg != ref_cavity->f2n[cell * 3 + 2])) {
                    for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
                      if ((((&face)[local_c0] < 0) || (ref_node_00->max <= (&face)[local_c0])) ||
                         (ref_node_00->global[(&face)[local_c0]] < 0)) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x29a,"ref_cavity_replace","cavity tet nodes not valid");
                        return 1;
                      }
                      if (ref_node_00->ref_mpi->id != ref_node_00->part[(&face)[local_c0]]) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x29b,"ref_cavity_replace","cavity tet nodes not local");
                        return 1;
                      }
                    }
                    uVar2 = ref_cell_add(stack0xffffffffffffffc8,&face,&i);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x29d,"ref_cavity_replace",(ulong)uVar2,"add");
                      return uVar2;
                    }
                    uVar2 = ref_node_tet_vol(ref_node_00,&face,(REF_DBL *)&ref_list);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x29e,"ref_cavity_replace",(ulong)uVar2,"norm");
                      return uVar2;
                    }
                    if ((double)ref_list <= ref_node_00->min_volume) {
                      printf("%d %d %d %d %e\n",ref_list,(ulong)(uint)face,(ulong)(uint)node,
                             (ulong)(uint)nodes[0],(ulong)(uint)nodes[1]);
                    }
                  }
                }
              }
              if (ref_cavity->surf_node == -1) {
                local_168 = ref_cavity->node;
              }
              else {
                local_168 = ref_cavity->surf_node;
              }
              seg = local_168;
              stack0xffffffffffffffc8 = ref_cavity->ref_grid->cell[3];
              for (new_cell = 0; new_cell < ref_cavity->maxseg; new_cell = new_cell + 1) {
                if (((-1 < new_cell) && (new_cell < ref_cavity->maxseg)) &&
                   (ref_cavity->s2n[new_cell * 3] != -1)) {
                  face = ref_cavity->s2n[new_cell * 3];
                  node = ref_cavity->s2n[new_cell * 3 + 1];
                  nodes[0] = seg;
                  nodes[1] = ref_cavity->s2n[new_cell * 3 + 2];
                  if ((seg != ref_cavity->s2n[new_cell * 3]) &&
                     (seg != ref_cavity->s2n[new_cell * 3 + 1])) {
                    for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
                      if ((((&face)[local_c0] < 0) || (ref_node_00->max <= (&face)[local_c0])) ||
                         (ref_node_00->global[(&face)[local_c0]] < 0)) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x2ad,"ref_cavity_replace","cavity tri nodes not valid");
                        return 1;
                      }
                      if (ref_node_00->ref_mpi->id != ref_node_00->part[(&face)[local_c0]]) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x2ae,"ref_cavity_replace","cavity tri nodes not local");
                        return 1;
                      }
                    }
                    uVar2 = ref_cell_add(stack0xffffffffffffffc8,&face,&i);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2b0,"ref_cavity_replace",(ulong)uVar2,"add");
                      return uVar2;
                    }
                  }
                }
              }
              ref_cavity_local._4_4_ = ref_list_create(&stack0xffffffffffffff28);
              if (ref_cavity_local._4_4_ == 0) {
                unique0x00012000 = ref_cavity->ref_grid->cell[8];
                for (volume._4_4_ = 0; volume._4_4_ < ref_cavity->tet_list->n;
                    volume._4_4_ = volume._4_4_ + 1) {
                  i = ref_cavity->tet_list->value[volume._4_4_];
                  uVar2 = ref_cell_nodes(stack0xffffffffffffffc8,i,&face);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x2b9,"ref_cavity_replace",(ulong)uVar2,"rm");
                    return uVar2;
                  }
                  for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
                    uVar2 = ref_list_push(pRStack_d8,(&face)[local_c0]);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,699,"ref_cavity_replace",(ulong)uVar2,"tet list");
                      return uVar2;
                    }
                    if ((((&face)[local_c0] < 0) || (ref_node_00->max <= (&face)[local_c0])) ||
                       (ref_node_00->global[(&face)[local_c0]] < 0)) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,700,"ref_cavity_replace","cavity rm tet nodes not valid");
                      return 1;
                    }
                    if (ref_node_00->ref_mpi->id != ref_node_00->part[(&face)[local_c0]]) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2bd,"ref_cavity_replace","cavity rm tet nodes not local");
                      return 1;
                    }
                  }
                  uVar2 = ref_cell_remove(stack0xffffffffffffffc8,i);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x2bf,"ref_cavity_replace",(ulong)uVar2,"rm tet");
                    return uVar2;
                  }
                }
                unique0x00012000 = ref_cavity->ref_grid->cell[3];
                for (volume._4_4_ = 0; volume._4_4_ < ref_cavity->tri_list->n;
                    volume._4_4_ = volume._4_4_ + 1) {
                  i = ref_cavity->tri_list->value[volume._4_4_];
                  uVar2 = ref_cell_nodes(stack0xffffffffffffffc8,i,&face);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x2c5,"ref_cavity_replace",(ulong)uVar2,"rm");
                    return uVar2;
                  }
                  for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
                    uVar2 = ref_list_push(pRStack_d8,(&face)[local_c0]);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2c7,"ref_cavity_replace",(ulong)uVar2,"tri list");
                      return uVar2;
                    }
                    if ((((&face)[local_c0] < 0) || (ref_node_00->max <= (&face)[local_c0])) ||
                       (ref_node_00->global[(&face)[local_c0]] < 0)) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2c8,"ref_cavity_replace","cavity rm tri nodes not valid");
                      return 1;
                    }
                    if (ref_node_00->ref_mpi->id != ref_node_00->part[(&face)[local_c0]]) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2c9,"ref_cavity_replace","cavity rm tri nodes not local");
                      return 1;
                    }
                  }
                  uVar2 = ref_cell_remove(stack0xffffffffffffffc8,i);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x2cb,"ref_cavity_replace",(ulong)uVar2,"rm tri");
                    return uVar2;
                  }
                }
                for (volume._4_4_ = 0; volume._4_4_ < pRStack_d8->n; volume._4_4_ = volume._4_4_ + 1
                    ) {
                  seg = pRStack_d8->value[volume._4_4_];
                  if (((-1 < seg) && (seg < ref_node_00->max)) && (-1 < ref_node_00->global[seg])) {
                    if ((seg < 0) || (pRVar1->cell[3]->ref_adj->nnode <= seg)) {
                      local_16c = -1;
                    }
                    else {
                      local_16c = pRVar1->cell[3]->ref_adj->first[seg];
                    }
                    if ((local_16c == -1) &&
                       (uVar2 = ref_geom_remove_all(ref_geom_00,seg), uVar2 != 0)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2d2,"ref_cavity_replace",(ulong)uVar2,"remove geom");
                      return uVar2;
                    }
                    if ((seg < 0) || (pRVar1->cell[3]->ref_adj->nnode <= seg)) {
                      local_170 = -1;
                    }
                    else {
                      local_170 = pRVar1->cell[3]->ref_adj->first[seg];
                    }
                    if (local_170 == -1) {
                      if ((seg < 0) || (pRVar1->cell[8]->ref_adj->nnode <= seg)) {
                        local_174 = -1;
                      }
                      else {
                        local_174 = pRVar1->cell[8]->ref_adj->first[seg];
                      }
                      if ((local_174 == -1) &&
                         (uVar2 = ref_node_remove(ref_node_00,seg), uVar2 != 0)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x2d6,"ref_cavity_replace",(ulong)uVar2,"remove node");
                        return uVar2;
                      }
                    }
                  }
                }
                if ((ref_cavity->split_node0 != -1) && (ref_cavity->split_node1 != -1)) {
                  face = ref_cavity->split_node0;
                  node = ref_cavity->split_node1;
                  unique0x00012000 = ref_cavity->ref_grid->cell[0];
                  uVar2 = ref_cell_with(unique0x00012000,&face,&i);
                  if ((uVar2 != 0) && (uVar2 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x2e0,"ref_cavity_replace",(ulong)uVar2,"find edg");
                    return uVar2;
                  }
                  if (i != -1) {
                    uVar2 = ref_cell_nodes(stack0xffffffffffffffc8,i,&face);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2e2,"ref_cavity_replace",(ulong)uVar2,"cell nodes");
                      return uVar2;
                    }
                    uVar2 = ref_cell_remove(stack0xffffffffffffffc8,i);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2e3,"ref_cavity_replace",(ulong)uVar2,"remove");
                      return uVar2;
                    }
                    face = ref_cavity->split_node0;
                    if (ref_cavity->surf_node == -1) {
                      local_178 = ref_cavity->node;
                    }
                    else {
                      local_178 = ref_cavity->surf_node;
                    }
                    node = local_178;
                    uVar2 = ref_cell_add(stack0xffffffffffffffc8,&face,&item);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2e6,"ref_cavity_replace",(ulong)uVar2,"add node0 version");
                      return uVar2;
                    }
                    if (ref_cavity->surf_node == -1) {
                      local_17c = ref_cavity->node;
                    }
                    else {
                      local_17c = ref_cavity->surf_node;
                    }
                    face = local_17c;
                    node = ref_cavity->split_node1;
                    uVar2 = ref_cell_add(stack0xffffffffffffffc8,&face,&item);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2e9,"ref_cavity_replace",(ulong)uVar2,"add node1 version");
                      return uVar2;
                    }
                  }
                }
                if ((ref_cavity->collapse_node0 != -1) && (ref_cavity->collapse_node1 != -1)) {
                  face = ref_cavity->collapse_node0;
                  node = ref_cavity->collapse_node1;
                  unique0x00012000 = ref_cavity->ref_grid->cell[0];
                  uVar2 = ref_cell_with(unique0x00012000,&face,&i);
                  if ((uVar2 != 0) && (uVar2 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x2f2,"ref_cavity_replace",(ulong)uVar2,"find edg");
                    return uVar2;
                  }
                  if (i != -1) {
                    uVar2 = ref_cell_nodes(stack0xffffffffffffffc8,i,&face);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2f4,"ref_cavity_replace",(ulong)uVar2,"cell nodes");
                      return uVar2;
                    }
                    uVar2 = ref_cell_remove(stack0xffffffffffffffc8,i);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2f5,"ref_cavity_replace",(ulong)uVar2,"remove");
                      return uVar2;
                    }
                    uVar2 = ref_cell_replace_node
                                      (stack0xffffffffffffffc8,ref_cavity->collapse_node1,
                                       ref_cavity->collapse_node0);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x2f8,"ref_cavity_replace",(ulong)uVar2,"replace node");
                      return uVar2;
                    }
                  }
                }
                seg = ref_cavity->node;
                unique0x00012000 = ref_cavity->ref_grid->cell[8];
                if ((seg < 0) || (unique0x00012000->ref_adj->nnode <= seg)) {
                  local_180 = -1;
                }
                else {
                  local_180 = unique0x00012000->ref_adj->first[seg];
                }
                volume._4_4_ = local_180;
                if (local_180 == -1) {
                  local_184 = -1;
                }
                else {
                  local_184 = unique0x00012000->ref_adj->item[local_180].ref;
                }
                i = local_184;
                while (volume._4_4_ != -1) {
                  uVar2 = ref_cell_nodes(stack0xffffffffffffffc8,i,&face);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x300,"ref_cavity_replace",(ulong)uVar2,"");
                    return uVar2;
                  }
                  for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
                    if ((((&face)[local_c0] < 0) || (ref_node_00->max <= (&face)[local_c0])) ||
                       (ref_node_00->global[(&face)[local_c0]] < 0)) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x303,"ref_cavity_replace","cavity replaced tet nodes not valid");
                      return 1;
                    }
                  }
                  volume._4_4_ = stack0xffffffffffffffc8->ref_adj->item[volume._4_4_].next;
                  if (volume._4_4_ == -1) {
                    local_188 = -1;
                  }
                  else {
                    local_188 = stack0xffffffffffffffc8->ref_adj->item[volume._4_4_].ref;
                  }
                  i = local_188;
                }
                unique0x00012000 = pRVar1->cell[8];
                if ((pRVar1->twod != 0) || (pRVar1->surf != 0)) {
                  unique0x00012000 = pRVar1->cell[3];
                }
                for (volume._4_4_ = 0; volume._4_4_ < pRStack_d8->n; volume._4_4_ = volume._4_4_ + 1
                    ) {
                  seg = pRStack_d8->value[volume._4_4_];
                  if (((-1 < seg) && (seg < ref_node_00->max)) && (-1 < ref_node_00->global[seg])) {
                    if ((seg < 0) || (stack0xffffffffffffffc8->ref_adj->nnode <= seg)) {
                      local_18c = -1;
                    }
                    else {
                      local_18c = stack0xffffffffffffffc8->ref_adj->first[seg];
                    }
                    if (local_18c == -1) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x30f,"ref_cavity_replace","element missing for valid node");
                      return 1;
                    }
                  }
                }
                ref_cavity_local._4_4_ = ref_list_free(pRStack_d8);
                if (ref_cavity_local._4_4_ == 0) {
                  ref_cavity_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x313,"ref_cavity_replace",(ulong)ref_cavity_local._4_4_,"list free");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x2b4,"ref_cavity_replace",(ulong)ref_cavity_local._4_4_,
                       "create removed node list");
              }
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x289,"ref_cavity_replace","attempt to replace cavity that is inconsistent",1,
                   (ulong)ref_cavity->state);
            ref_cavity_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x286,"ref_cavity_replace",(ulong)ref_cavity_local._4_4_,"replace seg manifold");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x285,"ref_cavity_replace",(ulong)ref_cavity_local._4_4_,"replace face manifold");
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x283,"ref_cavity_replace","attempt to replace cavity that is not visible",1,
             (ulong)ref_cavity->state);
      ref_cavity_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x280,
           "ref_cavity_replace",(ulong)ref_cavity_local._4_4_,"tec for replace fail");
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_replace(REF_CAVITY ref_cavity) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_INT face, seg;
  REF_INT cell, new_cell;
  REF_INT i, item;
  REF_DBL volume;
  REF_LIST ref_list;

  if (ref_cavity_debug(ref_cavity))
    RSS(ref_cavity_tec(ref_cavity, "ref_cavity_replace.tec"),
        "tec for replace fail");

  REIS(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
       "attempt to replace cavity that is not visible");

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "replace face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "replace seg manifold");

  REIS(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
       "attempt to replace cavity that is inconsistent");

  if (0 == ref_cavity_nseg(ref_cavity) && 0 == ref_cavity_nface(ref_cavity) &&
      0 == ref_list_n(ref_cavity_tri_list(ref_cavity)) &&
      0 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
    THROW("attempt noop");
  }
  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_face(ref_cavity, face) {
    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    nodes[3] = node;
    if (node == nodes[0] || node == nodes[1] || node == nodes[2])
      continue; /* attached face */
    for (i = 0; i < 4; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity tet nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity tet nodes not local");
    }
    RSS(ref_cell_add(ref_cell, nodes, &cell), "add");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "norm");
    if (volume <= ref_node_min_volume(ref_node))
      printf("%d %d %d %d %e\n", nodes[0], nodes[1], nodes[2], nodes[3],
             volume);
  }

  node = ref_cavity_seg_node(ref_cavity);
  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);
    if (node == nodes[0] || node == nodes[1]) continue; /* attached seg */
    for (i = 0; i < 3; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity tri nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity tri nodes not local");
    }
    RSS(ref_cell_add(ref_cell, nodes, &cell), "add");
    /* check validity, area? */
  }

  RSS(ref_list_create(&ref_list), "create removed node list");

  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "rm");
    for (i = 0; i < 4; i++) {
      RSS(ref_list_push(ref_list, nodes[i]), "tet list");
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity rm tet nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity rm tet nodes not local");
    }
    RSS(ref_cell_remove(ref_cell, cell), "rm tet");
  }

  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "rm");
    for (i = 0; i < 3; i++) {
      RSS(ref_list_push(ref_list, nodes[i]), "tri list");
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity rm tri nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity rm tri nodes not local");
    }
    RSS(ref_cell_remove(ref_cell, cell), "rm tri");
  }

  each_ref_list_item(ref_list, item) {
    node = ref_list_value(ref_list, item);
    if (ref_node_valid(ref_node, node)) {
      if (ref_cell_node_empty(ref_grid_tri(ref_grid), node)) {
        RSS(ref_geom_remove_all(ref_geom, node), "remove geom");
      }
      if (ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
          ref_cell_node_empty(ref_grid_tet(ref_grid), node)) {
        RSS(ref_node_remove(ref_node, node), "remove node");
      }
    }
  }

  if (ref_cavity->split_node0 != REF_EMPTY &&
      ref_cavity->split_node1 != REF_EMPTY) {
    nodes[0] = ref_cavity->split_node0;
    nodes[1] = ref_cavity->split_node1;
    ref_cell = ref_grid_edg(ref_cavity_grid(ref_cavity));
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find edg");
    if (REF_EMPTY != cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_cell_remove(ref_cell, cell), "remove");
      nodes[0] = ref_cavity->split_node0;
      nodes[1] = ref_cavity_seg_node(ref_cavity);
      RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
      nodes[0] = ref_cavity_seg_node(ref_cavity);
      nodes[1] = ref_cavity->split_node1;
      RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    }
  }

  if (ref_cavity->collapse_node0 != REF_EMPTY &&
      ref_cavity->collapse_node1 != REF_EMPTY) {
    nodes[0] = ref_cavity->collapse_node0;
    nodes[1] = ref_cavity->collapse_node1;
    ref_cell = ref_grid_edg(ref_cavity_grid(ref_cavity));
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find edg");
    if (REF_EMPTY != cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_cell_remove(ref_cell, cell), "remove");
      RSS(ref_cell_replace_node(ref_cell, ref_cavity->collapse_node1,
                                ref_cavity->collapse_node0),
          "replace node");
    }
  }

  /* self check to catch invalid node early */
  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "");
    for (i = 0; i < 4; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]),
          "cavity replaced tet nodes not valid");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  each_ref_list_item(ref_list, item) {
    node = ref_list_value(ref_list, item);
    if (ref_node_valid(ref_node, node)) {
      RAS(!ref_cell_node_empty(ref_cell, node),
          "element missing for valid node");
    }
  }

  RSS(ref_list_free(ref_list), "list free");

  return REF_SUCCESS;
}